

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O3

string * __thiscall
gmlc::utilities::stringOps::removeChars_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view source,string_view remchars)

{
  char *pcVar1;
  stringOps *psVar2;
  stringOps local_41;
  string *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_40 = __return_storage_ptr__;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(size_type)this);
  if (this != (stringOps *)0x0) {
    psVar2 = (stringOps *)0x0;
    do {
      local_41 = psVar2[source._M_len];
      pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (remchars._M_len,source._M_str + remchars._M_len,&local_41);
      if (pcVar1 == source._M_str + remchars._M_len) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                  (char)psVar2[source._M_len]);
      }
      psVar2 = psVar2 + 1;
    } while (this != psVar2);
  }
  return local_40;
}

Assistant:

std::string removeChars(std::string_view source, std::string_view remchars)
    {
        std::string result;
        result.reserve(source.length());
        std::remove_copy_if(
            source.begin(),
            source.end(),
            std::back_inserter(result),
            [remchars](char input) {
                return (
                    std::find(remchars.begin(), remchars.end(), input) !=
                    remchars.end());
            });
        return result;
    }